

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O0

UBool anon_unknown.dwarf_2344d6::cleanupNumberParseUniSets(void)

{
  UnicodeSet *this;
  void *in_RSI;
  int local_c;
  int32_t i;
  
  if ((anonymous_namespace)::gEmptyUnicodeSetInitialized != '\0') {
    icu_63::UnicodeSet::~UnicodeSet((UnicodeSet *)(anonymous_namespace)::gEmptyUnicodeSet);
    (anonymous_namespace)::gEmptyUnicodeSetInitialized = '\0';
  }
  for (local_c = 0; local_c < 0x16; local_c = local_c + 1) {
    this = (UnicodeSet *)(&(anonymous_namespace)::gUnicodeSets)[local_c];
    if (this != (UnicodeSet *)0x0) {
      icu_63::UnicodeSet::~UnicodeSet(this);
      icu_63::UMemory::operator_delete((UMemory *)this,in_RSI);
    }
    (&(anonymous_namespace)::gUnicodeSets)[local_c] = 0;
  }
  icu_63::UInitOnce::reset((UInitOnce *)&(anonymous_namespace)::gNumberParseUniSetsInitOnce);
  return '\x01';
}

Assistant:

UBool U_CALLCONV cleanupNumberParseUniSets() {
    if (gEmptyUnicodeSetInitialized) {
        reinterpret_cast<UnicodeSet*>(gEmptyUnicodeSet)->~UnicodeSet();
        gEmptyUnicodeSetInitialized = FALSE;
    }
    for (int32_t i = 0; i < COUNT; i++) {
        delete gUnicodeSets[i];
        gUnicodeSets[i] = nullptr;
    }
    gNumberParseUniSetsInitOnce.reset();
    return TRUE;
}